

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int b64_ntop(uchar *src,size_t srclength,char *target,size_t targsize)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong in_RCX;
  byte *pbVar5;
  long in_RDX;
  ulong in_RSI;
  long lVar6;
  byte *in_RDI;
  size_t i;
  uchar output [4];
  uchar input [3];
  size_t datalength;
  ulong local_40;
  byte local_33 [3];
  ulong local_30;
  ulong local_28;
  long local_20;
  ulong local_18;
  byte *local_10;
  int local_4;
  
  local_30 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (local_18 < 3) {
      local_28 = in_RCX;
      local_20 = in_RDX;
      if (local_18 != 0) {
        local_33[2] = 0;
        local_33[1] = 0;
        local_33[0] = 0;
        for (local_40 = 0; uVar1 = local_30, local_40 < local_18; local_40 = local_40 + 1) {
          bVar2 = *local_10;
          local_10 = local_10 + 1;
          local_33[local_40] = bVar2;
        }
        bVar2 = (byte)((int)(uint)local_33[0] >> 2);
        bVar3 = (local_33[0] & 3) * '\x10' + (char)((int)(uint)local_33[1] >> 4);
        bVar4 = (local_33[1] & 0xf) * '\x04' + (char)((int)(uint)local_33[2] >> 6);
        if (0x3f < bVar2) {
          abort();
        }
        if (0x3f < bVar3) {
          abort();
        }
        if (0x3f < bVar4) {
          abort();
        }
        if (local_28 < local_30 + 4) {
          return -1;
        }
        *(char *)(local_20 + local_30) =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2];
        *(char *)(local_20 + local_30 + 1) =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3];
        if (local_18 == 1) {
          *(undefined1 *)(local_20 + local_30 + 2) = 0x3d;
        }
        else {
          *(char *)(local_20 + local_30 + 2) =
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar4];
        }
        local_30 = local_30 + 3;
        *(undefined1 *)(local_20 + local_30) = 0x3d;
        local_30 = uVar1 + 4;
      }
      if (local_30 < local_28) {
        *(undefined1 *)(local_20 + local_30) = 0;
        local_4 = (int)local_30;
      }
      else {
        local_4 = -1;
      }
      return local_4;
    }
    local_33[0] = *local_10;
    pbVar5 = local_10 + 2;
    local_33[1] = local_10[1];
    local_10 = local_10 + 3;
    local_33[2] = *pbVar5;
    local_18 = local_18 - 3;
    bVar2 = (byte)((int)(uint)local_33[0] >> 2);
    bVar3 = (local_33[0] & 3) * '\x10' + (char)((int)(uint)local_33[1] >> 4);
    bVar4 = (local_33[1] & 0xf) * '\x04' + (char)((int)(uint)local_33[2] >> 6);
    if (0x3f < bVar2) {
      abort();
    }
    if (0x3f < bVar3) {
      abort();
    }
    if (0x3f < bVar4) {
      abort();
    }
    if (0x3f < (local_33[2] & 0x3f)) break;
    if (in_RCX < local_30 + 4) {
      return -1;
    }
    *(char *)(in_RDX + local_30) =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2];
    *(char *)(in_RDX + local_30 + 1) =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3];
    lVar6 = local_30 + 3;
    *(char *)(in_RDX + local_30 + 2) =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar4];
    local_30 = local_30 + 4;
    *(char *)(in_RDX + lVar6) =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[local_33[2] & 0x3f];
  }
  abort();
}

Assistant:

int
b64_ntop(unsigned char const *src, size_t srclength, char *target, size_t targsize) {
	size_t datalength = 0;
	unsigned char input[3];
	unsigned char output[4];
	size_t i;

	while (2 < srclength) {
		input[0] = *src++;
		input[1] = *src++;
		input[2] = *src++;
		srclength -= 3;

		output[0] = input[0] >> 2;
		output[1] = ((input[0] & 0x03) << 4) + (input[1] >> 4);
		output[2] = ((input[1] & 0x0f) << 2) + (input[2] >> 6);
		output[3] = input[2] & 0x3f;
		Assert(output[0] < 64);
		Assert(output[1] < 64);
		Assert(output[2] < 64);
		Assert(output[3] < 64);

		if (datalength + 4 > targsize)
			return (-1);
		target[datalength++] = Base64[output[0]];
		target[datalength++] = Base64[output[1]];
		target[datalength++] = Base64[output[2]];
		target[datalength++] = Base64[output[3]];
	}

	/* Now we worry about padding. */
	if (0 != srclength) {
		/* Get what's left. */
		input[0] = input[1] = input[2] = '\0';
		for (i = 0; i < srclength; i++)
			input[i] = *src++;
	
		output[0] = input[0] >> 2;
		output[1] = ((input[0] & 0x03) << 4) + (input[1] >> 4);
		output[2] = ((input[1] & 0x0f) << 2) + (input[2] >> 6);
		Assert(output[0] < 64);
		Assert(output[1] < 64);
		Assert(output[2] < 64);

		if (datalength + 4 > targsize)
			return (-1);
		target[datalength++] = Base64[output[0]];
		target[datalength++] = Base64[output[1]];
		if (srclength == 1)
			target[datalength++] = Pad64;
		else
			target[datalength++] = Base64[output[2]];
		target[datalength++] = Pad64;
	}
	if (datalength >= targsize)
		return (-1);
	target[datalength] = '\0';	/* Returned value doesn't count \0. */
	return (datalength);
}